

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

bool ImPlot::ShowColormapSelector(char *label)

{
  uint uVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImVec2 in_RAX;
  ulong uVar4;
  bool bVar5;
  char *pcVar6;
  ulong uVar7;
  ImVec2 local_28;
  
  pIVar2 = GImPlot;
  uVar1 = (GImPlot->Style).Colormap;
  local_28 = in_RAX;
  if ((int)uVar1 < (GImPlot->ColormapData).Count) {
    if (((int)uVar1 < 0) || ((GImPlot->ColormapData).TextOffsets.Size <= (int)uVar1)) {
LAB_001b9ab3:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68c,"const T &ImVector<int>::operator[](int) const [T = int]");
    }
    pcVar6 = (GImPlot->ColormapData).Text.Buf.Data + (GImPlot->ColormapData).TextOffsets.Data[uVar1]
    ;
  }
  else {
    pcVar6 = (char *)0x0;
  }
  bVar5 = false;
  bVar3 = ImGui::BeginCombo(label,pcVar6,0);
  if (bVar3) {
    uVar1 = (pIVar2->ColormapData).Count;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      bVar5 = false;
    }
    else {
      uVar7 = 0;
      bVar5 = false;
      do {
        if ((long)uVar7 < (long)(int)uVar4) {
          if ((long)(pIVar2->ColormapData).TextOffsets.Size <= (long)uVar7) goto LAB_001b9ab3;
          pcVar6 = (pIVar2->ColormapData).Text.Buf.Data +
                   (pIVar2->ColormapData).TextOffsets.Data[uVar7];
        }
        else {
          pcVar6 = (char *)0x0;
        }
        local_28.x = 0.0;
        local_28.y = 0.0;
        bVar3 = ImGui::Selectable(pcVar6,uVar7 == (uint)(pIVar2->Style).Colormap,0,&local_28);
        if (bVar3) {
          (pIVar2->Style).Colormap = (ImPlotColormap)uVar7;
          BustItemCache();
          bVar5 = true;
        }
        uVar7 = uVar7 + 1;
        uVar4 = (ulong)(pIVar2->ColormapData).Count;
      } while ((long)uVar7 < (long)uVar4);
    }
    ImGui::EndCombo();
  }
  return bVar5;
}

Assistant:

bool ShowColormapSelector(const char* label) {
    ImPlotContext& gp = *GImPlot;
    bool set = false;
    if (ImGui::BeginCombo(label, gp.ColormapData.GetName(gp.Style.Colormap))) {
        for (int i = 0; i < gp.ColormapData.Count; ++i) {
            const char* name = gp.ColormapData.GetName(i);
            if (ImGui::Selectable(name, gp.Style.Colormap == i)) {
                gp.Style.Colormap = i;
                ImPlot::BustItemCache();
                set = true;
            }
        }
        ImGui::EndCombo();
    }
    return set;
}